

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_resting_step_turn(player *p)

{
  byte *pbVar1;
  player_upkeep *ppVar2;
  
  ppVar2 = p->upkeep;
  if (L'\0' < ppVar2->resting) {
    ppVar2->resting = ppVar2->resting + L'\xffffffff';
    pbVar1 = (byte *)((long)&ppVar2->redraw + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  ppVar2->energy_use = (uint)z_info->move_energy;
  p->resting_turn = p->resting_turn + 1;
  player_turns_rested = player_turns_rested + L'\x01';
  return;
}

Assistant:

void player_resting_step_turn(struct player *p)
{
	/* Timed rest */
	if (p->upkeep->resting > 0) {
		/* Reduce rest count */
		p->upkeep->resting--;

		/* Redraw the state */
		p->upkeep->redraw |= (PR_STATE);
	}

	/* Take a turn */
	p->upkeep->energy_use = z_info->move_energy;

	/* Increment the resting counters */
	p->resting_turn++;
	player_turns_rested++;
}